

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_mf_cc.hpp
# Opt level: O3

bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
* __thiscall
boost::
bind<void,boost::unit_test::test_unit_fixture,boost::shared_ptr<boost::unit_test::test_unit_fixture>>
          (bind_t<void,_boost::_mfi::mf0<void,_boost::unit_test::test_unit_fixture>,_boost::_bi::list1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>_>
           *__return_storage_ptr__,boost *this,F f,
          shared_ptr<boost::unit_test::test_unit_fixture> *a1)

{
  element_type *peVar1;
  shared_count local_48;
  element_type *local_40;
  shared_count local_38;
  element_type *local_30;
  shared_count local_28;
  
  peVar1 = a1->px;
  local_38.pi_ = (a1->pn).pi_;
  if (local_38.pi_ == (sp_counted_base *)0x0) {
    local_28.pi_ = (sp_counted_base *)0x0;
  }
  else {
    LOCK();
    (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
    UNLOCK();
    LOCK();
    (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
    UNLOCK();
    LOCK();
    (local_38.pi_)->use_count_ = (local_38.pi_)->use_count_ + 1;
    UNLOCK();
    local_28.pi_ = local_38.pi_;
  }
  local_48.pi_ = local_28.pi_;
  local_40 = peVar1;
  local_30 = peVar1;
  detail::shared_count::~shared_count(&local_28);
  (__return_storage_ptr__->f_).f_ = (F)this;
  *(F *)&(__return_storage_ptr__->f_).field_0x8 = f;
  (__return_storage_ptr__->l_).
  super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.a1_.t_
  .px = peVar1;
  (__return_storage_ptr__->l_).
  super_storage1<boost::_bi::value<boost::shared_ptr<boost::unit_test::test_unit_fixture>_>_>.a1_.t_
  .pn.pi_ = local_48.pi_;
  if (local_48.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_48.pi_)->use_count_ = (local_48.pi_)->use_count_ + 1;
    UNLOCK();
  }
  detail::shared_count::~shared_count(&local_48);
  detail::shared_count::~shared_count(&local_38);
  return __return_storage_ptr__;
}

Assistant:

_bi::bind_t<R, _mfi::BOOST_BIND_MF_NAME(mf0)<R, T>, typename _bi::list_av_1<A1>::type>
    BOOST_BIND(R (BOOST_BIND_MF_CC T::*f) () BOOST_BIND_MF_NOEXCEPT, A1 a1)
{
    typedef _mfi::BOOST_BIND_MF_NAME(mf0)<R, T> F;
    typedef typename _bi::list_av_1<A1>::type list_type;
    return _bi::bind_t<R, F, list_type>(F(f), list_type(a1));
}